

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O3

void __thiscall
QAbstractScrollAreaPrivate::layoutChildren_helper
          (QAbstractScrollAreaPrivate *this,bool *needHorizontalScrollbar,
          bool *needVerticalScrollbar)

{
  ScrollBarPolicy SVar1;
  QWidget *widget;
  QWidgetData *pQVar2;
  QWidget *pQVar3;
  QHeaderView *this_00;
  QAbstractScrollAreaScrollBarContainer *pQVar4;
  Representation RVar5;
  undefined8 uVar6;
  Representation RVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  Representation RVar17;
  Orientation OVar18;
  LayoutDirection LVar19;
  QStyle *pQVar20;
  undefined8 uVar21;
  int extraout_var;
  Representation RVar22;
  long lVar23;
  undefined8 uVar24;
  undefined8 *puVar25;
  QRect *pQVar26;
  QStyleOptionSlider *pQVar27;
  Representation RVar28;
  int iVar30;
  bool bVar32;
  long lVar33;
  bool bVar34;
  byte bVar35;
  long in_FS_OFFSET;
  bool bVar36;
  QRect QVar37;
  QRect QVar38;
  QList<QHeaderView_*> list;
  QStyleOption opt;
  QStyleOptionSlider barOpt;
  Representation local_1a0;
  Representation local_188;
  QRect local_148;
  ulong local_138;
  QRect local_128;
  undefined1 local_118 [12];
  Representation RStack_10c;
  QRect local_108;
  undefined1 local_f8 [12];
  LayoutDirection LStack_ec;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  undefined1 *local_d8;
  QPalettePrivate *pQStack_d0;
  undefined1 *local_c8;
  QObject *pQStack_c0;
  QStyleOptionSlider local_b8;
  long local_38;
  Representation RVar29;
  Representation RVar31;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  widget = *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
  puVar25 = &DAT_006723b8;
  pQVar27 = &local_b8;
  for (lVar23 = 0x10; lVar23 != 0; lVar23 = lVar23 + -1) {
    uVar21 = *puVar25;
    (pQVar27->super_QStyleOptionComplex).super_QStyleOption.version = (int)uVar21;
    (pQVar27->super_QStyleOptionComplex).super_QStyleOption.type = (int)((ulong)uVar21 >> 0x20);
    puVar25 = puVar25 + 1;
    pQVar27 = (QStyleOptionSlider *)&(pQVar27->super_QStyleOptionComplex).super_QStyleOption.state;
  }
  QStyleOptionSlider::QStyleOptionSlider(&local_b8);
  (**(code **)(*(long *)&(this->hbar->super_QAbstractSlider).super_QWidget + 0x1a8))
            (this->hbar,&local_b8);
  pQVar20 = QWidget::style((QWidget *)this->hbar);
  iVar9 = (**(code **)(*(long *)pQVar20 + 0xf0))(pQVar20,0x60,&local_b8,this->hbar,0);
  bVar32 = true;
  bVar34 = true;
  if (*needHorizontalScrollbar == false) {
    SVar1 = this->hbarpolicy;
    if (SVar1 != ScrollBarAlwaysOff) {
      if (SVar1 == ScrollBarAlwaysOn) {
        bVar34 = true;
        if (iVar9 == 0) goto LAB_0038bf6c;
      }
      else if (iVar9 == 0 && SVar1 != ScrollBarAsNeeded) goto LAB_0038bf69;
      iVar10 = QAbstractSlider::minimum(&this->hbar->super_QAbstractSlider);
      iVar11 = QAbstractSlider::maximum(&this->hbar->super_QAbstractSlider);
      if (iVar10 < iVar11) {
        uVar21 = (**(code **)(*(long *)&(this->hbar->super_QAbstractSlider).super_QWidget + 0x70))()
        ;
        bVar34 = 0 < (int)((ulong)uVar21 >> 0x20) && 0 < (int)uVar21;
        goto LAB_0038bf6c;
      }
    }
LAB_0038bf69:
    bVar34 = false;
  }
LAB_0038bf6c:
  pQVar20 = QWidget::style((QWidget *)this->hbar);
  iVar10 = (**(code **)(*(long *)pQVar20 + 0xe0))(pQVar20,0x56,&local_b8,this->hbar);
  (**(code **)(*(long *)&(this->vbar->super_QAbstractSlider).super_QWidget + 0x1a8))
            (this->vbar,&local_b8);
  pQVar20 = QWidget::style((QWidget *)this->vbar);
  iVar11 = (**(code **)(*(long *)pQVar20 + 0xf0))(pQVar20,0x60,&local_b8,this->vbar,0);
  if (*needVerticalScrollbar == false) {
    SVar1 = this->vbarpolicy;
    if (SVar1 != ScrollBarAlwaysOff) {
      if (SVar1 == ScrollBarAlwaysOn) {
        if (iVar11 == 0) goto LAB_0038c05d;
      }
      else if (iVar11 == 0 && SVar1 != ScrollBarAsNeeded) goto LAB_0038c05a;
      iVar30 = QAbstractSlider::minimum(&this->vbar->super_QAbstractSlider);
      iVar12 = QAbstractSlider::maximum(&this->vbar->super_QAbstractSlider);
      if (iVar30 < iVar12) {
        uVar21 = (**(code **)(*(long *)&(this->vbar->super_QAbstractSlider).super_QWidget + 0x70))()
        ;
        bVar32 = 0 < (int)((ulong)uVar21 >> 0x20) && 0 < (int)uVar21;
        goto LAB_0038c05d;
      }
    }
LAB_0038c05a:
    bVar32 = false;
  }
LAB_0038c05d:
  pQVar20 = QWidget::style((QWidget *)this->vbar);
  iVar12 = (**(code **)(*(long *)pQVar20 + 0xe0))(pQVar20,0x56,&local_b8,this->vbar);
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_c0 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_d0 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
  local_f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffff10 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOption::QStyleOption((QStyleOption *)local_f8,0,0);
  QStyleOption::initFrom((QStyleOption *)local_f8,widget);
  (**(code **)(*(long *)&(this->hbar->super_QAbstractSlider).super_QWidget + 0x70))();
  iVar13 = (**(code **)(*(long *)&(this->vbar->super_QAbstractSlider).super_QWidget + 0x70))();
  pQVar2 = widget->data;
  local_108.x2.m_i = (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i;
  local_108.y2.m_i = (pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i;
  local_108.x1.m_i = 0;
  local_108.y1.m_i = 0;
  bVar8 = iVar12 == 0 & bVar32;
  iVar30 = 0;
  if (bVar8 != 0) {
    iVar30 = iVar13;
  }
  bVar35 = iVar10 == 0 & bVar34;
  iVar16 = 0;
  if (bVar35 != 0) {
    iVar16 = extraout_var;
  }
  pQVar3 = this->cornerWidget;
  stack0xfffffffffffffef0 = &DAT_aaaaaaaaaaaaaaaa;
  local_118._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  if ((this->super_QFramePrivate).frameStyle == 0) {
LAB_0038c2ce:
    local_148 = QStyle::visualRect(LStack_ec,(QRect *)&local_e8,&local_108);
    QFrame::setFrameRect((QFrame *)widget,&local_148);
    QVar38 = QWidget::contentsRect(widget);
    uVar21 = QVar38._0_8_;
    local_118._8_4_ = QVar38.x2.m_i.m_i - iVar30;
    local_118._0_4_ = (int)uVar21;
    local_118._4_4_ = SUB84(uVar21,4);
    RStack_10c.m_i = QVar38.y2.m_i.m_i - iVar16;
  }
  else {
    pQVar20 = QWidget::style(widget);
    iVar14 = (**(code **)(*(long *)pQVar20 + 0xf0))(pQVar20,0x11,local_f8,widget,0);
    uVar21 = local_108._0_8_;
    if (iVar14 == 0) goto LAB_0038c2ce;
    QVar38.x2.m_i = local_108.x2.m_i;
    QVar38.y2.m_i = local_108.y2.m_i;
    QVar38.x1.m_i = local_108.x1.m_i;
    QVar38.y1.m_i = local_108.y1.m_i;
    pQVar20 = QWidget::style(widget);
    iVar15 = (**(code **)(*(long *)pQVar20 + 0xe0))(pQVar20,0x55,local_f8,widget);
    iVar14 = iVar12 + iVar15;
    if (bVar32 == false) {
      iVar14 = 0;
    }
    iVar15 = iVar15 + iVar10;
    if (bVar34 == false) {
      iVar15 = 0;
    }
    local_148.x2.m_i = local_108.x2.m_i;
    local_148.y2.m_i = local_108.y2.m_i;
    local_148.x2.m_i = local_148.x2.m_i - (iVar14 + iVar30);
    local_148.x1.m_i = local_108.x1.m_i;
    local_148.y1.m_i = local_108.y1.m_i;
    local_148.y2.m_i = local_148.y2.m_i - (iVar15 + iVar16);
    local_128 = QStyle::visualRect(LStack_ec,(QRect *)&local_e8,&local_148);
    QFrame::setFrameRect((QFrame *)widget,&local_128);
    LVar19 = LStack_ec;
    local_128 = QWidget::contentsRect(widget);
    _local_118 = QStyle::visualRect(LVar19,(QRect *)&local_e8,&local_128);
  }
  bVar36 = pQVar3 != (QWidget *)0x0;
  iVar16 = 0;
  iVar30 = 0;
  if (bVar32 != false) {
    iVar30 = iVar13;
  }
  if (bVar34 != false) {
    iVar16 = extraout_var;
  }
  if (((bVar35 | bVar8) & bVar36) != 0) {
    iVar16 = extraout_var;
    iVar30 = iVar13;
  }
  RVar31 = QVar38.x2.m_i;
  iVar30 = RVar31.m_i - iVar30;
  RVar22.m_i = iVar30 + 1;
  RVar29 = QVar38.y2.m_i;
  RVar28.m_i = RVar29.m_i - iVar16;
  RVar17.m_i = RVar28.m_i + 1;
  if (((bVar34 & bVar32) == 1) && ((iVar12 == 0 && iVar10 == 0) && pQVar3 == (QWidget *)0x0)) {
    local_148.y1.m_i = RVar17.m_i;
    local_148.x1.m_i = RVar22.m_i;
    local_148.x2.m_i = iVar13 + iVar30;
    local_148.y2.m_i = extraout_var + RVar28.m_i;
    QVar37 = QStyle::visualRect(LStack_ec,(QRect *)&local_e8,&local_148);
    this->cornerPaintingRect = QVar37;
  }
  else {
    (this->cornerPaintingRect).x1 = 0;
    (this->cornerPaintingRect).y1 = 0;
    (this->cornerPaintingRect).x2 = -1;
    (this->cornerPaintingRect).y2 = -1;
  }
  if ((bVar32 & 0 < iVar12) == 0) {
    RVar5.m_i = 0;
    iVar12 = 0;
    if ((0 < iVar10 & bVar34) == 0) goto LAB_0038c5e5;
  }
  local_148 = (QRect)ZEXT816(0);
  local_138 = 0;
  RVar5.m_i = 0;
  qt_qFindChildren_helper(widget,0,0,&QHeaderView::staticMetaObject,&local_148,1);
  if (local_138 < 3) {
    iVar12 = 0;
    if (local_138 != 0) {
      uVar6 = local_148._8_8_;
      lVar33 = local_138 << 3;
      lVar23 = 0;
      uVar24 = 0;
      RVar5.m_i = 0;
      do {
        this_00 = *(QHeaderView **)(uVar6 + lVar23);
        local_128 = ((this_00->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                     super_QWidget.data)->crect;
        OVar18 = QHeaderView::orientation(this_00);
        if ((OVar18 == Vertical) &&
           ((((this_00->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
              super_QWidget.data)->widget_attributes & 0x8000) != 0)) {
          QVar37 = QStyle::visualRect(LStack_ec,(QRect *)&local_e8,&local_128);
          if (((puStack_e0._0_4_ - local_e8._0_4_) -
              ((puStack_e0._0_4_ - local_e8._0_4_) + 1 >> 0x1f)) + 1 >> 1 < QVar37.x1.m_i.m_i)
          goto LAB_0038c53d;
          QVar37 = QStyle::visualRect(LStack_ec,(QRect *)&local_e8,&local_128);
          uVar24 = QVar37._8_8_;
        }
        else {
LAB_0038c53d:
          OVar18 = QHeaderView::orientation(this_00);
          if ((OVar18 == Horizontal) &&
             ((((this_00->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                super_QWidget.data)->widget_attributes & 0x8000) != 0)) {
            RVar7.m_i = local_128.y1.m_i;
            iVar10 = QFrame::frameWidth((QFrame *)widget);
            if (RVar7.m_i <= iVar10) {
              RVar5.m_i = local_128.y2.m_i;
            }
          }
        }
        iVar12 = (int)uVar24;
        lVar23 = lVar23 + 8;
      } while (lVar33 != lVar23);
    }
  }
  else {
    iVar12 = 0;
  }
  if ((QArrayData *)local_148._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_148._0_8_,8,0x10);
    }
  }
LAB_0038c5e5:
  if (bVar34 != false) {
    local_1a0 = QVar38.x1.m_i;
    local_148.y1.m_i = RVar17.m_i;
    local_148.x1.m_i = iVar12 + local_1a0.m_i;
    local_148.x2.m_i = iVar30;
    if (iVar9 != 0 && !bVar36) {
      local_148.x2.m_i = RVar31.m_i;
    }
    local_148.y2.m_i = RVar29.m_i;
    local_148.x1.m_i = local_148.x1.m_i;
    local_148.y1.m_i = local_148.y1.m_i;
    local_148.x2.m_i = local_148.x2.m_i;
    pQVar4 = (this->scrollBarContainers).m_data[0];
    local_128 = QStyle::visualRect(LStack_ec,(QRect *)&local_e8,&local_148);
    pQVar26 = &local_128;
    QWidget::setGeometry(&pQVar4->super_QWidget,pQVar26);
    QWidget::raise(&(this->scrollBarContainers).m_data[0]->super_QWidget,(int)pQVar26);
  }
  if (bVar32 != false) {
    local_188.m_i = SUB84(uVar21,4);
    local_148.y1.m_i = RVar5.m_i + local_188.m_i;
    local_148.x1.m_i = RVar22.m_i;
    local_148.x2.m_i = RVar31.m_i;
    local_148.y2.m_i = RVar28.m_i;
    if (iVar11 != 0 && !bVar36) {
      local_148.y2.m_i = RVar29.m_i;
    }
    pQVar4 = (this->scrollBarContainers).m_data[1];
    local_128 = QStyle::visualRect(LStack_ec,(QRect *)&local_e8,&local_148);
    pQVar26 = &local_128;
    QWidget::setGeometry(&pQVar4->super_QWidget,pQVar26);
    QWidget::raise(&(this->scrollBarContainers).m_data[1]->super_QWidget,(int)pQVar26);
  }
  pQVar3 = this->cornerWidget;
  if (pQVar3 != (QWidget *)0x0) {
    local_148.y1.m_i = RVar17.m_i;
    local_148.x1.m_i = RVar22.m_i;
    local_148.x2.m_i = RVar31.m_i;
    local_148.y2.m_i = RVar29.m_i;
    local_128 = QStyle::visualRect(LStack_ec,(QRect *)&local_e8,&local_148);
    QWidget::setGeometry(pQVar3,&local_128);
  }
  pQVar4 = (this->scrollBarContainers).m_data[0];
  (**(code **)(*(long *)&pQVar4->super_QWidget + 0x68))(pQVar4,bVar34);
  pQVar4 = (this->scrollBarContainers).m_data[1];
  (**(code **)(*(long *)&pQVar4->super_QWidget + 0x68))(pQVar4,bVar32);
  LVar19 = QWidget::layoutDirection(widget);
  QVar38 = _local_118;
  local_118._4_4_ = local_118._4_4_ + this->top;
  local_118._0_4_ =
       local_118._0_4_ +
       ((Representation *)(&this->scrollBarContainers + 5))[(ulong)(LVar19 == RightToLeft) * 2 + 2].
       m_i;
  local_118._8_4_ = QVar38.x2.m_i;
  RStack_10c = QVar38.y2.m_i;
  local_118._8_4_ =
       local_118._8_4_ -
       ((Representation *)(&this->scrollBarContainers + 5))[(ulong)(LVar19 != RightToLeft) * 2 + 2].
       m_i;
  RStack_10c.m_i = RStack_10c.m_i - this->bottom;
  QVar38 = QStyle::visualRect(LStack_ec,(QRect *)&local_e8,(QRect *)local_118);
  iVar9 = (this->overshoot).xp.m_i;
  iVar10 = (this->overshoot).yp.m_i;
  local_118._4_4_ = QVar38.y1.m_i.m_i - iVar10;
  local_118._0_4_ = QVar38.x1.m_i.m_i - iVar9;
  local_118._8_4_ = QVar38.x2.m_i.m_i - iVar9;
  RStack_10c.m_i = QVar38.y2.m_i.m_i - iVar10;
  QWidget::setGeometry(this->viewport,(QRect *)local_118);
  *needHorizontalScrollbar = bVar34;
  *needVerticalScrollbar = bVar32;
  QStyleOption::~QStyleOption((QStyleOption *)local_f8);
  QStyleOption::~QStyleOption((QStyleOption *)&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractScrollAreaPrivate::layoutChildren_helper(bool *needHorizontalScrollbar, bool *needVerticalScrollbar)
{
    Q_Q(QAbstractScrollArea);
    QStyleOptionSlider barOpt;

    hbar->initStyleOption(&barOpt);
    bool htransient = hbar->style()->styleHint(QStyle::SH_ScrollBar_Transient, &barOpt, hbar);
    bool needh = *needHorizontalScrollbar || ((hbarpolicy != Qt::ScrollBarAlwaysOff) && ((hbarpolicy == Qt::ScrollBarAlwaysOn && !htransient)
                            || ((hbarpolicy == Qt::ScrollBarAsNeeded || htransient)
                            && hbar->minimum() < hbar->maximum() && !hbar->sizeHint().isEmpty())));
    const int hscrollOverlap = hbar->style()->pixelMetric(QStyle::PM_ScrollView_ScrollBarOverlap, &barOpt, hbar);

    vbar->initStyleOption(&barOpt);
    bool vtransient = vbar->style()->styleHint(QStyle::SH_ScrollBar_Transient, &barOpt, vbar);
    bool needv = *needVerticalScrollbar || ((vbarpolicy != Qt::ScrollBarAlwaysOff) && ((vbarpolicy == Qt::ScrollBarAlwaysOn && !vtransient)
                            || ((vbarpolicy == Qt::ScrollBarAsNeeded || vtransient)
                            && vbar->minimum() < vbar->maximum() && !vbar->sizeHint().isEmpty())));
    const int vscrollOverlap = vbar->style()->pixelMetric(QStyle::PM_ScrollView_ScrollBarOverlap, &barOpt, vbar);

    QStyleOption opt(0);
    opt.initFrom(q);

    const int hsbExt = hbar->sizeHint().height();
    const int vsbExt = vbar->sizeHint().width();
    const QPoint extPoint(vsbExt, hsbExt);
    const QSize extSize(vsbExt, hsbExt);

    const QRect widgetRect = q->rect();

    const bool hasCornerWidget = (cornerWidget != nullptr);

    QPoint cornerOffset((needv && vscrollOverlap == 0) ? vsbExt : 0, (needh && hscrollOverlap == 0) ? hsbExt : 0);
    QRect controlsRect;
    QRect viewportRect;

    // In FrameOnlyAroundContents mode the frame is drawn between the controls and
    // the viewport, else the frame rect is equal to the widget rect.
    if ((frameStyle != QFrame::NoFrame) &&
        q->style()->styleHint(QStyle::SH_ScrollView_FrameOnlyAroundContents, &opt, q)) {
        controlsRect = widgetRect;
        const int spacing = q->style()->pixelMetric(QStyle::PM_ScrollView_ScrollBarSpacing, &opt, q);
        const QPoint cornerExtra(needv ? spacing + vscrollOverlap : 0, needh ? spacing + hscrollOverlap : 0);
        QRect frameRect = widgetRect;
        frameRect.adjust(0, 0, -cornerOffset.x() - cornerExtra.x(), -cornerOffset.y() - cornerExtra.y());
        q->setFrameRect(QStyle::visualRect(opt.direction, opt.rect, frameRect));
        // The frame rect needs to be in logical coords, however we need to flip
        // the contentsRect back before passing it on to the viewportRect
        // since the viewportRect has its logical coords calculated later.
        viewportRect = QStyle::visualRect(opt.direction, opt.rect, q->contentsRect());
    } else {
        q->setFrameRect(QStyle::visualRect(opt.direction, opt.rect, widgetRect));
        controlsRect = q->contentsRect();
        viewportRect = QRect(controlsRect.topLeft(), controlsRect.bottomRight() - cornerOffset);
    }

    cornerOffset = QPoint(needv ? vsbExt : 0, needh ? hsbExt : 0);

    // If we have a corner widget and are only showing one scroll bar, we need to move it
    // to make room for the corner widget.
    if (hasCornerWidget && ((needv && vscrollOverlap == 0) || (needh && hscrollOverlap == 0)))
        cornerOffset =  extPoint;

    // The corner point is where the scroll bar rects, the corner widget rect and the
    // viewport rect meets.
    const QPoint cornerPoint(controlsRect.bottomRight() + QPoint(1, 1) - cornerOffset);

    // Some styles paints the corner if both scorllbars are showing and there is
    // no corner widget.
    if (needv && needh && !hasCornerWidget && hscrollOverlap == 0 && vscrollOverlap == 0)
        cornerPaintingRect = QStyle::visualRect(opt.direction, opt.rect, QRect(cornerPoint, extSize));
    else
        cornerPaintingRect = QRect();

    // move the scrollbars away from top/left headers
    int vHeaderRight = 0;
    int hHeaderBottom = 0;
#if QT_CONFIG(itemviews)
    if ((vscrollOverlap > 0 && needv) || (hscrollOverlap > 0 && needh)) {
        const QList<QHeaderView *> headers = q->findChildren<QHeaderView*>();
        if (headers.size() <= 2) {
            for (const QHeaderView *header : headers) {
                const QRect geo = header->geometry();
                if (header->orientation() == Qt::Vertical && header->isVisible() && QStyle::visualRect(opt.direction, opt.rect, geo).left() <= opt.rect.width() / 2)
                    vHeaderRight = QStyle::visualRect(opt.direction, opt.rect, geo).right();
                else if (header->orientation() == Qt::Horizontal && header->isVisible() && geo.top() <= q->frameWidth())
                    hHeaderBottom = geo.bottom();
             }
         }
    }
#endif // QT_CONFIG(itemviews)
    if (needh) {
        QRect horizontalScrollBarRect(QPoint(controlsRect.left() + vHeaderRight, cornerPoint.y()), QPoint(cornerPoint.x() - 1, controlsRect.bottom()));

        if (!hasCornerWidget && htransient)
            horizontalScrollBarRect.adjust(0, 0, cornerOffset.x(), 0);
        scrollBarContainers[Qt::Horizontal]->setGeometry(QStyle::visualRect(opt.direction, opt.rect, horizontalScrollBarRect));
        scrollBarContainers[Qt::Horizontal]->raise();
    }

    if (needv) {
        QRect verticalScrollBarRect  (QPoint(cornerPoint.x(), controlsRect.top() + hHeaderBottom),  QPoint(controlsRect.right(), cornerPoint.y() - 1));
        if (!hasCornerWidget && vtransient)
            verticalScrollBarRect.adjust(0, 0, 0, cornerOffset.y());
        scrollBarContainers[Qt::Vertical]->setGeometry(QStyle::visualRect(opt.direction, opt.rect, verticalScrollBarRect));
        scrollBarContainers[Qt::Vertical]->raise();
    }

    if (cornerWidget) {
        const QRect cornerWidgetRect(cornerPoint, controlsRect.bottomRight());
        cornerWidget->setGeometry(QStyle::visualRect(opt.direction, opt.rect, cornerWidgetRect));
    }

    scrollBarContainers[Qt::Horizontal]->setVisible(needh);
    scrollBarContainers[Qt::Vertical]->setVisible(needv);

    if (q->isRightToLeft())
        viewportRect.adjust(right, top, -left, -bottom);
    else
        viewportRect.adjust(left, top, -right, -bottom);
    viewportRect = QStyle::visualRect(opt.direction, opt.rect, viewportRect);
    viewportRect.translate(-overshoot);
    viewport->setGeometry(viewportRect); // resize the viewport last

    *needHorizontalScrollbar = needh;
    *needVerticalScrollbar = needv;
}